

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O0

int pg::update_block_rec_SYNC_SLOW(WorkerP *w,Task *__dq_head)

{
  Worker *pWVar1;
  int iVar2;
  ulong uVar3;
  size_t diff;
  Task *t_1;
  Worker *wt;
  TD_update_block_rec *t;
  Task *__dq_head_local;
  WorkerP *w_local;
  
  if (w->allstolen == '\0') {
    if (__dq_head < w->split) {
      iVar2 = lace_shrink_shared(w);
      if (iVar2 != 0) goto LAB_001e7fb6;
    }
    pWVar1 = w->_public;
    if (pWVar1->movesplit != '\0') {
      uVar3 = ((long)__dq_head - (long)w->split >> 6) + 1U >> 1;
      w->split = w->split + uVar3;
      std::__atomic_base<unsigned_int>::operator+=
                (&(pWVar1->ts).ts.split.super___atomic_base<unsigned_int>,(__int_type)uVar3);
      pWVar1->movesplit = '\0';
    }
    std::atomic_store_explicit<_Worker*>
              (&__dq_head->thief,(__atomic_val_t<_Worker_*>)0x0,memory_order_relaxed);
    w_local._4_4_ =
         update_block_rec_CALL
                   (w,__dq_head,*(FPISolver **)__dq_head->d,*(int *)(__dq_head->d + 8),
                    *(int *)(__dq_head->d + 0xc));
  }
  else {
LAB_001e7fb6:
    lace_leapfrog(w,__dq_head);
    w_local._4_4_ = *(int *)__dq_head->d;
  }
  return w_local._4_4_;
}

Assistant:

TASK_3(int, update_block_rec, FPISolver*, solver, int, i, int, n)
{
    return solver->update_block_rec(__lace_worker, __lace_dq_head, i, n);
}